

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_ManMemUsageUseful(Au_Man_t *p)

{
  int iVar1;
  Au_Ntk_t *pAVar2;
  int local_20;
  int local_1c;
  int Mem;
  int i;
  Au_Ntk_t *pNtk;
  Au_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 1; iVar1 = Vec_PtrSize(&p->vNtks), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Au_ManNtk(p,local_1c);
    local_20 = pAVar2->nObjsUsed * 0x10 + local_20;
  }
  return local_20;
}

Assistant:

int Au_ManMemUsageUseful( Au_Man_t * p )
{
    Au_Ntk_t * pNtk;
    int i, Mem = 0;
    Au_ManForEachNtk( p, pNtk, i )
        Mem += 16 * pNtk->nObjsUsed;
    return Mem;
}